

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O3

Vec_Ptr_t * Bac_ManCollectGateNamesByTruth(Mio_Library_t *pLib)

{
  Vec_Ptr_t *vGateNames;
  void **ppvVar1;
  
  vGateNames = (Vec_Ptr_t *)malloc(0x10);
  vGateNames->nCap = 0xb;
  ppvVar1 = (void **)calloc(1,0x58);
  vGateNames->pArray = ppvVar1;
  vGateNames->nSize = 0xb;
  Bac_ManCollectGateNameOne(pLib,PTR_GATE_C0,0,vGateNames);
  Bac_ManCollectGateNameOne(pLib,PTR_GATE_C1,0xffffffffffffffff,vGateNames);
  Bac_ManCollectGateNameOne(pLib,PTR_GATE_BUF,0xaaaaaaaaaaaaaaaa,vGateNames);
  Bac_ManCollectGateNameOne(pLib,PTR_GATE_INV,0x5555555555555555,vGateNames);
  Bac_ManCollectGateNameOne(pLib,PTR_GATE_AND,0x8888888888888888,vGateNames);
  Bac_ManCollectGateNameOne(pLib,PTR_GATE_NAND,0x7777777777777777,vGateNames);
  Bac_ManCollectGateNameOne(pLib,PTR_GATE_OR,0xeeeeeeeeeeeeeeee,vGateNames);
  Bac_ManCollectGateNameOne(pLib,PTR_GATE_NOR,0x1111111111111111,vGateNames);
  Bac_ManCollectGateNameOne(pLib,PTR_GATE_XOR,0x6666666666666666,vGateNames);
  Bac_ManCollectGateNameOne(pLib,PTR_GATE_XNOR,0x9999999999999999,vGateNames);
  return vGateNames;
}

Assistant:

Vec_Ptr_t * Bac_ManCollectGateNamesByTruth( Mio_Library_t * pLib )
{
    static word uTruths6[3] = {
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
    };
    Vec_Ptr_t * vGateNames = Vec_PtrStart( PTR_GATE_UNKNOWN );
    Bac_ManCollectGateNameOne( pLib, PTR_GATE_C0,              0,                 vGateNames );
    Bac_ManCollectGateNameOne( pLib, PTR_GATE_C1,       ~(word)0,                 vGateNames );
    Bac_ManCollectGateNameOne( pLib, PTR_GATE_BUF,    uTruths6[0],                vGateNames );
    Bac_ManCollectGateNameOne( pLib, PTR_GATE_INV,   ~uTruths6[0],                vGateNames );
    Bac_ManCollectGateNameOne( pLib, PTR_GATE_AND,   (uTruths6[0] & uTruths6[1]), vGateNames );
    Bac_ManCollectGateNameOne( pLib, PTR_GATE_NAND, ~(uTruths6[0] & uTruths6[1]), vGateNames );
    Bac_ManCollectGateNameOne( pLib, PTR_GATE_OR,    (uTruths6[0] | uTruths6[1]), vGateNames );
    Bac_ManCollectGateNameOne( pLib, PTR_GATE_NOR,  ~(uTruths6[0] | uTruths6[1]), vGateNames );
    Bac_ManCollectGateNameOne( pLib, PTR_GATE_XOR,   (uTruths6[0] ^ uTruths6[1]), vGateNames );
    Bac_ManCollectGateNameOne( pLib, PTR_GATE_XNOR, ~(uTruths6[0] ^ uTruths6[1]), vGateNames );
    return vGateNames;
}